

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ClosureTest_TestClosureFunction2_Test::
~ClosureTest_TestClosureFunction2_Test(ClosureTest_TestClosureFunction2_Test *this)

{
  ClosureTest_TestClosureFunction2_Test *this_local;
  
  ~ClosureTest_TestClosureFunction2_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(ClosureTest, TestClosureFunction2) {
  const char* cstr = "hello";
  Closure* closure = NewCallback(&SetABFunction, 789, cstr);
  EXPECT_NE(789, a_);
  EXPECT_NE(cstr, b_);
  closure->Run();
  EXPECT_EQ(789, a_);
  EXPECT_EQ(cstr, b_);
}